

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O1

void __thiscall
JsUtil::
Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>
::Cache(Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>
        *this,AllocatorType *allocator,int capacity)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  CacheStore *this_01;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  (this->cacheStore).ptr = (CacheStore *)0x0;
  MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>::MRURetentionPolicy
            (&this->cachePolicyType,allocator);
  local_58 = (undefined1  [8])
             &Cache<Js::EvalMapStringInternal<true>,Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,Js::ScriptFunction*,JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>,Js::EvalMapStringInternal<false>>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,15,Memory::Recycler>,Js::FastEvalMapStringComparer,JsUtil::SimpleDictionaryEntry>
              ::CacheStore::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2dabbf9;
  data.filename._0_4_ = 0xa4;
  this_00 = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_58);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0079dd46;
    *puVar4 = 0;
  }
  this_01 = (CacheStore *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_00,0x40);
  if (this_01 == (CacheStore *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_0079dd46:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_01,allocator,capacity);
  this_01->inAdd = false;
  Memory::Recycler::WBSetBit((char *)this);
  (this->cacheStore).ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return;
}

Assistant:

Cache(AllocatorType * allocator, int capacity = 0):
            cachePolicyType(allocator)
        {
            this->cacheStore = AllocatorNew(AllocatorType, allocator, CacheStore, allocator, capacity);
        }